

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::PathTypeHandlerBase::AddBlankFieldAt
          (PathTypeHandlerBase *this,PropertyId propertyId,PropertyIndex index,
          ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  uint16 uVar4;
  TypePath *pTVar5;
  undefined4 *puVar6;
  ScriptContext *scriptContext_local;
  PropertyIndex index_local;
  PropertyId propertyId_local;
  PathTypeHandlerBase *this_local;
  
  bVar2 = FixPropsOnPathTypes();
  if (bVar2) {
    pTVar5 = GetTypePath(this);
    bVar3 = TypePath::GetMaxInitializedLength(pTVar5);
    if (index < bVar3) {
      InvalidateFixedFieldAt(this,propertyId,index,scriptContext);
      pTVar5 = GetTypePath(this);
      bVar3 = TypePath::GetMaxInitializedLength(pTVar5);
      if (index + 1 == (uint)bVar3) {
        bVar2 = HasSingletonInstanceOnlyIfNeeded(this);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                      ,0xc49,"(HasSingletonInstanceOnlyIfNeeded())",
                                      "HasSingletonInstanceOnlyIfNeeded()");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        pTVar5 = GetTypePath(this);
        TypePath::ClearSingletonInstance(pTVar5);
      }
    }
    else {
      pTVar5 = GetTypePath(this);
      bVar3 = TypePath::GetMaxInitializedLength(pTVar5);
      if (index != bVar3) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                    ,0xc36,
                                    "(index == this->GetTypePath()->GetMaxInitializedLength())",
                                    "Adding properties out of order?");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      pTVar5 = GetTypePath(this);
      uVar4 = GetPathLength(this);
      TypePath::AddBlankFieldAt(pTVar5,index,(uint)uVar4);
    }
  }
  return;
}

Assistant:

void PathTypeHandlerBase::AddBlankFieldAt(Js::PropertyId propertyId, Js::PropertyIndex index, ScriptContext* scriptContext)
    {
        if (!FixPropsOnPathTypes())
        {
            return;
        }

        if (index >= this->GetTypePath()->GetMaxInitializedLength())
        {
            // We are adding a property where no instance property has been set before.  We rely on properties being
            // added in order of indexes to be sure that we don't leave any uninitialized properties interspersed with
            // initialized ones, which could lead to incorrect behavior.  See comment in TypePath::Branch.
            AssertMsg(index == this->GetTypePath()->GetMaxInitializedLength(), "Adding properties out of order?");

            this->GetTypePath()->AddBlankFieldAt(index, GetPathLength());
        }
        else
        {
            InvalidateFixedFieldAt(propertyId, index, scriptContext);

            // We have now reached the most advanced instance along this path.  If this instance is not the singleton instance,
            // then the former singleton instance (if any) is no longer a singleton.  This instance could be the singleton
            // instance, if we just happen to set (overwrite) its last property.
            if (index + 1 == this->GetTypePath()->GetMaxInitializedLength())
            {
                // If we cleared the singleton instance while some fields remained fixed, the instance would
                // be collectible, and yet some code would expect to see values and call methods on it. We rely on the
                // fact that we always add properties to (pre-initialized) type handlers in the order they appear
                // on the type path.  By the time we reach the singleton instance, all fixed fields will have been invalidated.
                // Otherwise, some fields could remain fixed (or even uninitialized) and we would have to spin off a loop here
                // to invalidate any remaining fixed fields
                Assert(HasSingletonInstanceOnlyIfNeeded());
                this->GetTypePath()->ClearSingletonInstance();
            }

        }
    }